

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_Type.cxx
# Opt level: O3

void __thiscall Fl_Menu_Type::copy_properties(Fl_Menu_Type *this)

{
  Fl_Menu_ *this_00;
  Fl_Widget *pFVar1;
  undefined8 uVar2;
  
  Fl_Widget_Type::copy_properties(&this->super_Fl_Widget_Type);
  this_00 = (Fl_Menu_ *)(this->super_Fl_Widget_Type).live_widget;
  pFVar1 = (this->super_Fl_Widget_Type).o;
  Fl_Menu_::menu(this_00,(Fl_Menu_Item *)pFVar1[1]._vptr_Fl_Widget);
  this_00->down_box_ = *(uchar *)((long)&pFVar1[1].callback_ + 1);
  this_00->textcolor_ = *(Fl_Color *)((long)&pFVar1[1].user_data_ + 4);
  uVar2 = *(undefined8 *)((long)&pFVar1[1].callback_ + 4);
  this_00->textfont_ = (int)uVar2;
  this_00->textsize_ = (int)((ulong)uVar2 >> 0x20);
  return;
}

Assistant:

void Fl_Menu_Type::copy_properties() {
  Fl_Widget_Type::copy_properties();
  Fl_Menu_ *s = (Fl_Menu_*)o, *d = (Fl_Menu_*)live_widget;
  d->menu(s->menu());
  d->down_box(s->down_box());
  d->textcolor(s->textcolor());
  d->textfont(s->textfont());
  d->textsize(s->textsize());
}